

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O1

void graymodel_add(graymodel *gm,double x,double y,double gray)

{
  gm->A[0][0] = x * x + gm->A[0][0];
  gm->A[0][1] = x * y + gm->A[0][1];
  gm->A[0][2] = gm->A[0][2] + x;
  gm->A[1][1] = y * y + gm->A[1][1];
  gm->A[1][2] = gm->A[1][2] + y;
  gm->A[2][2] = gm->A[2][2] + 1.0;
  gm->B[0] = x * gray + gm->B[0];
  gm->B[1] = y * gray + gm->B[1];
  gm->B[2] = gray + gm->B[2];
  return;
}

Assistant:

void graymodel_add(struct graymodel *gm, double x, double y, double gray)
{
    // update upper right entries of A = J'J
    gm->A[0][0] += x*x;
    gm->A[0][1] += x*y;
    gm->A[0][2] += x;
    gm->A[1][1] += y*y;
    gm->A[1][2] += y;
    gm->A[2][2] += 1;

    // update B = J'gray
    gm->B[0] += x * gray;
    gm->B[1] += y * gray;
    gm->B[2] += gray;
}